

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O2

TonkResult tonk_socket_create(TonkSocketConfig *config,TonkSocket *socketOut,TonkJson *errorJsonOut)

{
  int iVar1;
  TonkResult TVar2;
  OutputWorker *this;
  ErrorResult *pEVar3;
  ApplicationSession *this_00;
  allocator local_59;
  undefined1 local_58 [32];
  Result result;
  Result success;
  
  local_58._0_8_ = &m_SessionCounterLock;
  std::recursive_mutex::lock(&m_SessionCounterLock.cs);
  if (m_SessionCounter == 0) {
    this = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Start(this);
    StartWLANOptimizerThread();
    tonk::Firewall_Initialize();
  }
  m_SessionCounter = m_SessionCounter + 1;
  tonk::Locker::~Locker((Locker *)local_58);
  result.Error = (ErrorResult *)0x0;
  if (config == (TonkSocketConfig *)0x0 || socketOut == (TonkSocket *)0x0) {
    std::__cxx11::string::string((string *)local_58,"Null parameter",&local_59);
    pEVar3 = (ErrorResult *)operator_new(0x38);
    pEVar3->Source = "tonk_socket_create";
    std::__cxx11::string::string((string *)&pEVar3->Description,(string *)local_58);
    pEVar3->Type = Tonk;
    pEVar3->Code = 2;
    success.Error = (ErrorResult *)0x0;
    result.Error = pEVar3;
    tonk::Result::~Result(&success);
    std::__cxx11::string::~string((string *)local_58);
    if (socketOut != (TonkSocket *)0x0) goto LAB_0013e093;
  }
  else {
    if (config->Version == 9) {
      iVar1 = siamese_init_(5);
      if (iVar1 != 0) {
        std::__cxx11::string::string((string *)local_58,"siamese_init failed",&local_59);
        pEVar3 = (ErrorResult *)operator_new(0x38);
        pEVar3->Source = "tonk_socket_create";
        std::__cxx11::string::string((string *)&pEVar3->Description,(string *)local_58);
        pEVar3->Type = Siamese;
        pEVar3->Code = (long)iVar1;
        goto LAB_0013e076;
      }
      tonk::SecureRandom_Initialize();
      result.Error = (ErrorResult *)local_58._0_8_;
      local_58._0_8_ = (ErrorResult *)0x0;
      tonk::Result::~Result((Result *)local_58);
      if (result.Error == (ErrorResult *)0x0) {
        tonk::InitializeAddressHash();
        result.Error = (ErrorResult *)local_58._0_8_;
        local_58._0_8_ = (ErrorResult *)0x0;
        tonk::Result::~Result((Result *)local_58);
        if (result.Error == (ErrorResult *)0x0) {
          if (config->UDPConnectIntervalUsec < 30000) {
            std::__cxx11::string::string
                      ((string *)local_58,"UDPConnectIntervalUsec < 30 ms invalid",&local_59);
            pEVar3 = (ErrorResult *)operator_new(0x38);
            pEVar3->Source = "ValidateTonkSocketConfig";
            std::__cxx11::string::string((string *)&pEVar3->Description,(string *)local_58);
LAB_0013e27a:
            pEVar3->Type = Tonk;
            pEVar3->Code = 1;
LAB_0013e289:
            std::__cxx11::string::~string((string *)local_58);
          }
          else {
            if (1000000 < config->UDPConnectIntervalUsec) {
              std::__cxx11::string::string
                        ((string *)local_58,"UDPConnectIntervalUsec > 1 second invalid",&local_59);
              pEVar3 = (ErrorResult *)operator_new(0x38);
              pEVar3->Source = "ValidateTonkSocketConfig";
              std::__cxx11::string::string((string *)&pEVar3->Description,(string *)local_58);
              goto LAB_0013e27a;
            }
            if (config->ConnectionTimeoutUsec < 1000000) {
              std::__cxx11::string::string
                        ((string *)local_58,"ConnectionTimeoutUsec < 1 second invalid",&local_59);
              pEVar3 = (ErrorResult *)operator_new(0x38);
              pEVar3->Source = "ValidateTonkSocketConfig";
              std::__cxx11::string::string((string *)&pEVar3->Description,(string *)local_58);
              goto LAB_0013e27a;
            }
            if (180000000 < config->ConnectionTimeoutUsec) {
              std::__cxx11::string::string
                        ((string *)local_58,"ConnectionTimeoutUsec > 3 minutes invalid",&local_59);
              pEVar3 = (ErrorResult *)operator_new(0x38);
              pEVar3->Source = "ValidateTonkSocketConfig";
              std::__cxx11::string::string((string *)&pEVar3->Description,(string *)local_58);
              goto LAB_0013e27a;
            }
            if (config->UDPListenPort != 0) {
              if (config->OnIncomingConnection ==
                  (_func_uint32_t_TonkAppContextPtr_TonkConnection_TonkAddress_ptr_TonkConnectionConfig_ptr
                   *)0x0) {
                std::__cxx11::string::string
                          ((string *)local_58,"OnIncomingConnection null",&local_59);
                pEVar3 = (ErrorResult *)operator_new(0x38);
                pEVar3->Source = "ValidateTonkSocketConfig";
                std::__cxx11::string::string((string *)&pEVar3->Description,(string *)local_58);
              }
              else {
                if (config->UDPListenPort < 0x10000) goto LAB_0013e3c2;
                std::__cxx11::string::string((string *)local_58,"UDPPort invalid",&local_59);
                pEVar3 = (ErrorResult *)operator_new(0x38);
                pEVar3->Source = "ValidateTonkSocketConfig";
                std::__cxx11::string::string((string *)&pEVar3->Description,(string *)local_58);
              }
LAB_0013e52c:
              pEVar3->Type = Tonk;
              pEVar3->Code = 1;
              success.Error = pEVar3;
              goto LAB_0013e289;
            }
LAB_0013e3c2:
            if (config->TimerIntervalUsec < 5000) {
              std::__cxx11::string::string
                        ((string *)local_58,"TimerIntervalMsec < TONK_TIMER_INTERVAL_MIN invalid",
                         &local_59);
              pEVar3 = (ErrorResult *)operator_new(0x38);
              pEVar3->Source = "ValidateTonkSocketConfig";
              std::__cxx11::string::string((string *)&pEVar3->Description,(string *)local_58);
              goto LAB_0013e52c;
            }
            if (100000 < config->TimerIntervalUsec) {
              std::__cxx11::string::string
                        ((string *)local_58,"TimerIntervalMsec > TONK_TIMER_INTERVAL_MAX invalid",
                         &local_59);
              pEVar3 = (ErrorResult *)operator_new(0x38);
              pEVar3->Source = "ValidateTonkSocketConfig";
              std::__cxx11::string::string((string *)&pEVar3->Description,(string *)local_58);
              goto LAB_0013e52c;
            }
            if (config->NoDataTimeoutUsec < 2000000) {
              std::__cxx11::string::string
                        ((string *)local_58,
                         "NoDataTimeoutUsec < TONK_NO_DATA_TIMEOUT_USEC_MIN invalid",&local_59);
              pEVar3 = (ErrorResult *)operator_new(0x38);
              pEVar3->Source = "ValidateTonkSocketConfig";
              std::__cxx11::string::string((string *)&pEVar3->Description,(string *)local_58);
              goto LAB_0013e52c;
            }
            if (600000000 < config->NoDataTimeoutUsec) {
              std::__cxx11::string::string
                        ((string *)local_58,
                         "NoDataTimeoutUsec > TONK_NO_DATA_TIMEOUT_USEC_MAX invalid",&local_59);
              pEVar3 = (ErrorResult *)operator_new(0x38);
              pEVar3->Source = "ValidateTonkSocketConfig";
              std::__cxx11::string::string((string *)&pEVar3->Description,(string *)local_58);
              goto LAB_0013e52c;
            }
            pEVar3 = (ErrorResult *)0x0;
          }
          success.Error = (ErrorResult *)0x0;
          result.Error = pEVar3;
          tonk::Result::~Result(&success);
          if (result.Error == (ErrorResult *)0x0) {
            this_00 = (ApplicationSession *)operator_new(0x3ac8,(nothrow_t *)&std::nothrow);
            if (this_00 == (ApplicationSession *)0x0) {
              std::__cxx11::string::string((string *)local_58,"Out of memory",&local_59);
              pEVar3 = (ErrorResult *)operator_new(0x38);
              pEVar3->Source = "tonk_socket_create";
              std::__cxx11::string::string((string *)&pEVar3->Description,(string *)local_58);
              pEVar3->Type = Tonk;
              pEVar3->Code = 2;
              goto LAB_0013e076;
            }
            tonk::ApplicationSession::ApplicationSession(this_00);
            tonk::ApplicationSession::Initialize
                      ((ApplicationSession *)local_58,(TonkSocketConfig *)this_00);
            result.Error = (ErrorResult *)local_58._0_8_;
            local_58._0_8_ = (ErrorResult *)0x0;
            tonk::Result::~Result((Result *)local_58);
            if (result.Error == (ErrorResult *)0x0) {
              *socketOut = (TonkSocket)this_00;
              goto LAB_0013e09c;
            }
            (*(this_00->super_INATPortPool)._vptr_INATPortPool[1])(this_00);
          }
        }
      }
    }
    else {
      std::__cxx11::string::string
                ((string *)local_58,"config.Version does not match TONK_VERSION in header",&local_59
                );
      pEVar3 = (ErrorResult *)operator_new(0x38);
      pEVar3->Source = "tonk_socket_create";
      std::__cxx11::string::string((string *)&pEVar3->Description,(string *)local_58);
      pEVar3->Type = Tonk;
      pEVar3->Code = 1;
LAB_0013e076:
      success.Error = (ErrorResult *)0x0;
      result.Error = pEVar3;
      tonk::Result::~Result(&success);
      std::__cxx11::string::~string((string *)local_58);
    }
LAB_0013e093:
    *socketOut = (TonkSocket)0x0;
  }
  DecrementSessionCounter();
LAB_0013e09c:
  if (errorJsonOut != (TonkJson *)0x0) {
    tonk::Result::ToJson_abi_cxx11_((string *)local_58,&result);
    strncpy(errorJsonOut->JsonString,(char *)local_58._0_8_,0x400);
    errorJsonOut->JsonString[0x3ff] = '\0';
    std::__cxx11::string::~string((string *)local_58);
  }
  TVar2 = TonkResultFromDetailedResult(&result);
  tonk::Result::~Result(&result);
  return TVar2;
}

Assistant:

TONK_EXPORT TonkResult tonk_socket_create(
    const TonkSocketConfig* config, // Configuration for the socket
    TonkSocket*          socketOut, // Created socket, or 0 on failure
    TonkJson*         errorJsonOut  // Receives detailed error message on error
)
{
    IncrementSessionCounter();

    ApplicationSession* session = nullptr;
    Result result;
    int siameseResult;

    if (!config || !socketOut)
    {
        result = Result("tonk_socket_create", "Null parameter");
        TONK_DEBUG_BREAK(); // Invalid input
        goto OnError;
    }

    if (config->Version != TONK_VERSION)
    {
        TONK_DEBUG_BREAK(); // Invalid input
        result = Result("tonk_socket_create", "config.Version does not match TONK_VERSION in header", ErrorType::Tonk, Tonk_InvalidInput);
        goto OnError;
    }

    siameseResult = siamese_init();
    if (0 != siameseResult)
    {
        TONK_DEBUG_BREAK(); // Should never happen
        result = Result("tonk_socket_create", "siamese_init failed", ErrorType::Siamese, siameseResult);
        goto OnError;
    }

    result = SecureRandom_Initialize();
    if (result.IsFail())
    {
        TONK_DEBUG_BREAK(); // Should never happen
        goto OnError;
    }

    result = InitializeAddressHash();
    if (result.IsFail())
    {
        TONK_DEBUG_BREAK(); // PRNG failed
        goto OnError;
    }

    result = ValidateTonkSocketConfig(config);
    if (result.IsFail())
    {
        TONK_DEBUG_BREAK(); // Invalid input
        goto OnError;
    }

    session = new (std::nothrow) ApplicationSession;
    if (!session)
    {
        TONK_DEBUG_BREAK(); // Out of memory
        result = Result("tonk_socket_create", "Out of memory");
        goto OnError;
    }

    result = session->Initialize(*config);
    if (result.IsFail())
    {
        delete session;
        session = nullptr;
        goto OnError;
    }

OnError:
    if (socketOut)
        *socketOut = reinterpret_cast<TonkSocket>(session);

    if (!session)
        DecrementSessionCounter();

    // Write optional error json object
    if (errorJsonOut)
        SafeCopyCStr(
            errorJsonOut->JsonString,
            TONK_ERROR_JSON_MAX_BYTES,
            result.ToJson().c_str());
    return TonkResultFromDetailedResult(result);
}